

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTriangles.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTrianglesIdenticalTriangles::initTest
          (TessellationShaderTrianglesIdenticalTriangles *this)

{
  _tessellation_levels *p_Var1;
  bool bVar2;
  int iVar3;
  GLenum GVar4;
  NotSupportedError *this_00;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TessellationShaderUtils *this_01;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  TestError *pTVar8;
  vector<char,_std::allocator<char>_> local_5b0;
  vector<char,_std::allocator<char>_> local_598;
  MessageBuilder local_580;
  MessageBuilder local_400;
  MessageBuilder local_280;
  uint local_100;
  uint local_fc;
  GLint n_reference_vertices;
  GLint n_base_vertices;
  _tessellation_levels *set;
  _run run;
  __normal_iterator<glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
  local_80;
  __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
  local_78;
  _tessellation_levels_set_const_iterator set_iterator;
  _tessellation_levels_set levels_sets;
  _tessellation_level_set_filter filter;
  GLint gl_max_tess_gen_level_value;
  Functions *gl;
  allocator<char> local_31;
  string local_30;
  TessellationShaderTrianglesIdenticalTriangles *local_10;
  TessellationShaderTrianglesIdenticalTriangles *this_local;
  Functions *gl_00;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Tessellation shader functionality not supported, skipping",
               &local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar3);
  this_01 = (TessellationShaderUtils *)operator_new(0x20);
  TessellationShaderUtils::TessellationShaderUtils(this_01,gl_00,&this->super_TestCaseBase);
  this->m_utils = this_01;
  (*gl_00->genVertexArrays)(1,&this->m_vao_id);
  GVar4 = (*gl_00->getError)();
  glu::checkError(GVar4,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                  ,0x248);
  (*gl_00->bindVertexArray)(this->m_vao_id);
  GVar4 = (*gl_00->getError)();
  glu::checkError(GVar4,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                  ,0x24b);
  levels_sets.
  super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  (*gl_00->getIntegerv)
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,
             (GLint *)((long)&levels_sets.
                              super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  GVar4 = (*gl_00->getError)();
  glu::checkError(GVar4,"glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                  ,0x251);
  levels_sets.
  super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 9;
  TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
            ((_tessellation_levels_set *)&set_iterator,TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
             levels_sets.
             super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
             TESSELLATION_LEVEL_SET_FILTER_EXCLUDE_NEGATIVE_BASE_VALUE|
             TESSELLATION_LEVEL_SET_FILTER_ALL_COMBINATIONS);
  local_80._M_current =
       (_tessellation_levels *)
       std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::begin
                 ((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                   *)&set_iterator);
  __gnu_cxx::
  __normal_iterator<glcts::_tessellation_levels_const*,std::vector<glcts::_tessellation_levels,std::allocator<glcts::_tessellation_levels>>>
  ::__normal_iterator<glcts::_tessellation_levels*>
            ((__normal_iterator<glcts::_tessellation_levels_const*,std::vector<glcts::_tessellation_levels,std::allocator<glcts::_tessellation_levels>>>
              *)&local_78,&local_80);
  while( true ) {
    run._96_8_ = std::
                 vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
                 end((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                      *)&set_iterator);
    bVar2 = __gnu_cxx::operator!=
                      (&local_78,
                       (__normal_iterator<glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
                        *)&run.n_vertices);
    if (!bVar2) {
      std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
      ~vector((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *)
              &set_iterator);
      return;
    }
    _run::_run((_run *)&set);
    _n_reference_vertices =
         __gnu_cxx::
         __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
         ::operator*(&local_78);
    p_Var1 = *(_tessellation_levels **)_n_reference_vertices->inner;
    run.base_inner = *(float (*) [2])_n_reference_vertices->outer;
    run.base_outer._0_8_ = *(undefined8 *)(_n_reference_vertices->outer + 2);
    set._0_4_ = SUB84(p_Var1,0);
    run.base_outer[2] = set._0_4_;
    set._4_4_ = (float)((ulong)p_Var1 >> 0x20);
    run.base_outer[3] = set._4_4_ * 0.25;
    run.reference_inner[0] = run.base_inner[0];
    run.reference_inner[1] = run.base_inner[1];
    run.reference_outer[0] = run.base_outer[0];
    run.reference_outer[1] = run.base_outer[1] * 0.25;
    local_fc = 0;
    local_100 = 0;
    set = p_Var1;
    local_fc = TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                         (this->m_utils,TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,(float *)&set,
                          run.base_inner,TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,false);
    local_100 = TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                          (this->m_utils,TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
                           run.base_outer + 2,run.reference_inner,
                           TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,false);
    if (local_fc == 0) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_280,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_280,
                          (char (*) [67])
                          "No vertices were generated by tessellator for: inner tess levels:[");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(float *)&set);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(float *)((long)&set + 4));
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [23])"], outer tess levels:[");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run.base_inner);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run.base_inner + 1);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run.base_outer);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run.base_outer + 1);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,(char (*) [53])
                                 "], primitive mode: triangles, vertex spacing: equal.");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_280);
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,"Zero vertices were generated by tessellator for base test pass",(char *)0x0
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                 ,0x284);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (local_100 == 0) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_400,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_400,
                          (char (*) [67])
                          "No vertices were generated by tessellator for: inner tess levels:[");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run.base_outer + 2);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run.base_outer + 3);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [23])"], outer tess levels:[");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run.reference_inner);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run.reference_inner + 1);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run.reference_outer);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run.reference_outer + 1);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,(char (*) [53])
                                 "], primitive mode: triangles, vertex spacing: equal.");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_400);
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,"Zero vertices were generated by tessellator for reference test pass",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                 ,0x295);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (local_fc != local_100) break;
    run.reference_data.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = local_fc;
    TessellationShaderUtils::getDataGeneratedByTessellator
              (&local_598,this->m_utils,(float *)&set,false,
               TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
               TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,run.base_inner);
    std::vector<char,_std::allocator<char>_>::operator=
              ((vector<char,_std::allocator<char>_> *)(run.reference_outer + 2),&local_598);
    std::vector<char,_std::allocator<char>_>::~vector(&local_598);
    TessellationShaderUtils::getDataGeneratedByTessellator
              (&local_5b0,this->m_utils,run.base_outer + 2,false,
               TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
               TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,run.reference_inner);
    std::vector<char,_std::allocator<char>_>::operator=
              ((vector<char,_std::allocator<char>_> *)
               &run.base_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
               &local_5b0);
    std::vector<char,_std::allocator<char>_>::~vector(&local_5b0);
    std::
    vector<glcts::TessellationShaderTrianglesIdenticalTriangles::_run,_std::allocator<glcts::TessellationShaderTrianglesIdenticalTriangles::_run>_>
    ::push_back(&this->m_runs,(value_type *)&set);
    _run::~_run((_run *)&set);
    __gnu_cxx::
    __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
    ::operator++(&local_78,0);
  }
  pTVar6 = tcu::TestContext::getLog
                     ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_580,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_580,
                      (char (*) [115])
                      "Amount of vertices generated by the tessellator differs for the following inner/outer configs: inner tess levels:["
                     );
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(float *)&set);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(float *)((long)&set + 4));
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [23])"], outer tess levels:[");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run.base_inner);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run.base_inner + 1);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run.base_outer);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run.base_outer + 1);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [26])"] and inner tess levels:[");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run.base_outer + 2);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run.base_outer + 3);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [23])"], outer tess levels:[");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run.reference_inner);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run.reference_inner + 1);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run.reference_outer);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run.reference_outer + 1);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (pMVar7,(char (*) [53])"], primitive mode: triangles, vertex spacing: equal.");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_580);
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,
             "Amount of vertices generated by tessellator differs between base and references passes"
             ,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
             ,0x2ae);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void TessellationShaderTrianglesIdenticalTriangles::initTest()
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize Utils instance */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_utils = new TessellationShaderUtils(gl, this);

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Initialize all test runs */
	_tessellation_level_set_filter filter =
		(_tessellation_level_set_filter)((int)TESSELLATION_LEVEL_SET_FILTER_ALL_COMBINATIONS |
										 (int)TESSELLATION_LEVEL_SET_FILTER_EXCLUDE_NEGATIVE_BASE_VALUE);

	_tessellation_levels_set levels_sets = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
		TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES, gl_max_tess_gen_level_value, filter);

	for (_tessellation_levels_set_const_iterator set_iterator = levels_sets.begin(); set_iterator != levels_sets.end();
		 set_iterator++)
	{
		_run						run;
		const _tessellation_levels& set = *set_iterator;

		memcpy(run.base_inner, set.inner, sizeof(run.base_inner));
		memcpy(run.base_outer, set.outer, sizeof(run.base_outer));

		run.reference_inner[0] = run.base_inner[0];
		run.reference_inner[1] = run.base_inner[1] * 0.25f;

		run.reference_outer[0] = run.base_outer[0];
		run.reference_outer[1] = run.base_outer[1];
		run.reference_outer[2] = run.base_outer[2];
		run.reference_outer[3] = run.base_outer[3] * 0.25f;

		/* Retrieve vertex data for both passes */
		glw::GLint n_base_vertices		= 0;
		glw::GLint n_reference_vertices = 0;

		n_base_vertices = m_utils->getAmountOfVerticesGeneratedByTessellator(
			TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES, run.base_inner, run.base_outer,
			TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, false);
		n_reference_vertices = m_utils->getAmountOfVerticesGeneratedByTessellator(
			TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES, run.reference_inner, run.reference_outer,
			TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, false); /* is_point_mode_enabled */

		if (n_base_vertices == 0)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "No vertices were generated by tessellator for: "
														   "inner tess levels:"
														   "["
							   << run.base_inner[0] << ", " << run.base_inner[1] << "]"
																					", outer tess levels:"
																					"["
							   << run.base_outer[0] << ", " << run.base_outer[1] << ", " << run.base_outer[2] << ", "
							   << run.base_outer[3] << "]"
													   ", primitive mode: triangles, vertex spacing: equal."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Zero vertices were generated by tessellator for base test pass");
		}

		if (n_reference_vertices == 0)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "No vertices were generated by tessellator for: "
														   "inner tess levels:"
														   "["
							   << run.reference_inner[0] << ", " << run.reference_inner[1] << "]"
																							  ", outer tess levels:"
																							  "["
							   << run.reference_outer[0] << ", " << run.reference_outer[1] << ", "
							   << run.reference_outer[2] << ", " << run.reference_outer[3]
							   << "]"
								  ", primitive mode: triangles, vertex spacing: equal."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Zero vertices were generated by tessellator for reference test pass");
		}

		if (n_base_vertices != n_reference_vertices)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Amount of vertices generated by the tessellator differs"
														   " for the following inner/outer configs: "
														   "inner tess levels:"
														   "["
							   << run.base_inner[0] << ", " << run.base_inner[1] << "]"
																					", outer tess levels:"
																					"["
							   << run.base_outer[0] << ", " << run.base_outer[1] << ", " << run.base_outer[2] << ", "
							   << run.base_outer[3] << "]"
													   " and inner tess levels:"
													   "["
							   << run.reference_inner[0] << ", " << run.reference_inner[1] << "]"
																							  ", outer tess levels:"
																							  "["
							   << run.reference_outer[0] << ", " << run.reference_outer[1] << ", "
							   << run.reference_outer[2] << ", " << run.reference_outer[3]
							   << "]"
								  ", primitive mode: triangles, vertex spacing: equal."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Amount of vertices generated by tessellator differs between base and references passes");
		}

		run.n_vertices = n_base_vertices;

		run.base_data = m_utils->getDataGeneratedByTessellator(
			run.base_inner, false, /* is_point_mode_enabled */
			TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES, TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
			TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, run.base_outer);
		run.reference_data = m_utils->getDataGeneratedByTessellator(
			run.reference_inner, false, /* is_point_mode_enabled */
			TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES, TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
			TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, run.reference_outer);

		/* Store the run data */
		m_runs.push_back(run);
	} /* for (all sets) */
}